

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  uint n;
  TableEntryPtr TVar1;
  Arena *this_00;
  KeyNode *node_00;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  map_index_t b_00;
  TableEntryPtr *pTVar5;
  MixingHashState MVar6;
  TableEntryPtr *pTVar7;
  pointer __s;
  string *psVar8;
  string *extraout_RAX;
  NodeBase *pNVar9;
  UntypedMapBase *this_01;
  unsigned_long *puVar10;
  UntypedMapBase *this_02;
  ulong uVar11;
  ViewType k;
  ViewType k_00;
  NodeAndBucket NVar12;
  UntypedMapBase UStack_98;
  KeyNode *pKStack_78;
  unsigned_long auStack_70 [2];
  UntypedMapBase *pUStack_60;
  ulong uStack_58;
  undefined1 auStack_28 [16];
  
  pNVar9 = (NodeBase *)(ulong)b;
  this_01 = (UntypedMapBase *)auStack_28;
  uVar11 = (ulong)b;
  uVar4 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar4 == (this->super_UntypedMapBase).num_buckets_) ||
     ((this->super_UntypedMapBase).table_[uVar4] != 0)) {
    pNVar9 = node[2].super_NodeBase.next;
    k._M_str = (char *)node[1].super_NodeBase.next;
    k._M_len = (size_t)pNVar9;
    NVar12 = FindHelper(this,k,(TreeIterator *)0x0);
    if (NVar12.node == (NodeBase *)0x0) {
      TVar1 = (this->super_UntypedMapBase).table_[uVar11];
      if (TVar1 == 0) {
        UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
        uVar4 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar4 < b) {
          b = uVar4;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
        return;
      }
      if (((TVar1 & 1) == 0) &&
         (bVar3 = UntypedMapBase::TableEntryIsTooLong(&this->super_UntypedMapBase,b), !bVar3)) {
        UntypedMapBase::InsertUniqueInList(&this->super_UntypedMapBase,b,&node->super_NodeBase);
        return;
      }
      UntypedMapBase::InsertUniqueInTree
                (&this->super_UntypedMapBase,b,NodeToVariantKey,&node->super_NodeBase);
      return;
    }
    KeyMapBase<std::__cxx11::string>::InsertUnique(auStack_28);
  }
  KeyMapBase<std::__cxx11::string>::InsertUnique(auStack_28);
  puVar10 = auStack_70;
  uStack_58 = uVar11;
  if (this_01->num_buckets_ == 1) {
    this_01->index_of_first_non_null_ = 2;
    this_01->num_buckets_ = 2;
    this_00 = (this_01->alloc_).arena_;
    if (this_00 == (Arena *)0x0) {
      pKStack_78 = (KeyNode *)0x1bc7f1;
      pTVar5 = (TableEntryPtr *)operator_new(0x10);
    }
    else {
      pKStack_78 = (KeyNode *)0x1bc7e5;
      pTVar5 = (TableEntryPtr *)Arena::AllocateForArray(this_00,0x10);
    }
    *pTVar5 = 0;
    pTVar5[1] = 0;
    this_01->table_ = pTVar5;
    auStack_70[0] = rdtsc();
    pKStack_78 = (KeyNode *)0x1bc82e;
    pUStack_60 = this_01;
    MVar6 = absl::lts_20240722::hash_internal::
            HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
            combine<unsigned_long,google::protobuf::internal::TableEntryPtr*,void_const*>
                      ((MixingHashState)&absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                       auStack_70,&this_01->table_,&pUStack_60);
    this_01->seed_ = (map_index_t)MVar6.state_;
    return;
  }
  uVar4 = (uint)pNVar9;
  if (uVar4 < 2) {
    pKStack_78 = (KeyNode *)0x1bc8ed;
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((ulong)pNVar9 & 0xffffffff,2,"new_num_buckets >= kMinTableSize");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 != (string *)0x0) {
    pKStack_78 = (KeyNode *)0x1bc8fd;
    KeyMapBase<std::__cxx11::string>::Resize();
    this_02 = &UStack_98;
    uVar4 = (uint)psVar8;
    uVar11 = (ulong)psVar8 & 0xffffffff;
    UStack_98.table_ = (TableEntryPtr *)this_01;
    UStack_98.alloc_.arena_ = (Arena *)this;
    pKStack_78 = node;
    if (uVar4 < 2) {
      psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (uVar11,2,"n >= kMinTableSize");
    }
    else {
      psVar8 = (string *)0x0;
    }
    if (psVar8 == (string *)0x0) {
      uVar4 = uVar4 - 1 & uVar4;
      if (uVar4 == 0) {
        psVar8 = (string *)0x0;
      }
      else {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)uVar4,0,"n & (n - 1) == 0u");
      }
      if (psVar8 == (string *)0x0) {
        UStack_98._0_8_ = *(undefined8 *)((long)puVar10 + 0x18);
        __s = MapAllocator<google::protobuf::internal::TableEntryPtr>::allocate
                        ((MapAllocator<google::protobuf::internal::TableEntryPtr> *)&UStack_98,
                         uVar11,(void *)0x0);
        memset(__s,0,uVar11 << 3);
        return;
      }
    }
    else {
      UntypedMapBase::CreateEmptyTable();
      psVar8 = extraout_RAX;
    }
    UntypedMapBase::CreateEmptyTable();
    do {
      psVar2 = *(string **)psVar8;
      k_00._M_str = *(char **)(psVar8 + 8);
      k_00._M_len = *(size_t *)(psVar8 + 0x10);
      b_00 = BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this_02,k_00);
      InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_02,b_00,(KeyNode *)psVar8);
      psVar8 = psVar2;
    } while (psVar2 != (string *)0x0);
    return;
  }
  pTVar5 = this_01->table_;
  n = this_01->num_buckets_;
  this_01->num_buckets_ = uVar4;
  pKStack_78 = (KeyNode *)0x1bc86b;
  pTVar7 = UntypedMapBase::CreateEmptyTable(this_01,uVar4);
  this_01->table_ = pTVar7;
  uVar4 = this_01->index_of_first_non_null_;
  uVar11 = (ulong)uVar4;
  this_01->index_of_first_non_null_ = this_01->num_buckets_;
  if (uVar4 < n) {
    do {
      node_00 = (KeyNode *)pTVar5[uVar11];
      if (((ulong)node_00 & 1) == 0 && node_00 != (KeyNode *)0x0) {
        pKStack_78 = (KeyNode *)0x1bc8a0;
        TransferList((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_01,node_00);
      }
      else if (((ulong)node_00 & 1) != 0) {
        pKStack_78 = (KeyNode *)0x1bc8b6;
        UntypedMapBase::TransferTree
                  (this_01,(Tree *)((long)&node_00[-1].super_NodeBase.next + 7),NodeToVariantKey);
      }
      uVar11 = uVar11 + 1;
    } while (n != uVar11);
  }
  UntypedMapBase::DeleteTable(this_01,pTVar5,n);
  return;
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                !TableEntryIsEmpty(index_of_first_non_null_));
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(node->key()).node == nullptr);
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, NodeToVariantKey, node);
    }
  }